

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_definitions.hpp
# Opt level: O0

double __thiscall
units::detail::extraValidConversions<units::unit,units::precise_unit>
          (detail *this,double val,unit *start,precise_unit *result)

{
  precise_unit *this_00;
  unit *puVar1;
  bool bVar2;
  double __x;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  bool local_61;
  bool local_39;
  unit local_38;
  unit local_30;
  precise_unit *local_28;
  precise_unit *result_local;
  unit *start_local;
  double val_local;
  
  local_28 = (precise_unit *)start;
  result_local = (precise_unit *)this;
  start_local = (unit *)val;
  unit::pow((unit *)&m,val,(double)CONCAT44(in_XMM1_Db,in_XMM1_Da));
  bVar2 = unit::has_same_base((unit *)this,&local_30);
  local_39 = false;
  if (bVar2) {
    local_39 = precise_unit::has_same_base(local_28,(unit *)&J);
  }
  puVar1 = start_local;
  if (local_39 == false) {
    bVar2 = unit::has_same_base((unit *)result_local,(unit *)&J);
    this_00 = local_28;
    local_61 = false;
    if (bVar2) {
      unit::pow((unit *)&m,__x,(double)CONCAT44(in_XMM1_Db,in_XMM1_Da));
      local_61 = precise_unit::has_same_base(this_00,&local_38);
    }
    puVar1 = start_local;
    if (local_61 == false) {
      val_local = NAN;
    }
    else {
      dVar3 = unit::multiplier((unit *)result_local);
      dVar4 = precise_unit::multiplier((precise_unit *)precise::energy::scm);
      dVar5 = precise_unit::multiplier(local_28);
      val_local = (((double)puVar1 * dVar3) / dVar4) / dVar5;
    }
  }
  else {
    dVar3 = unit::multiplier((unit *)result_local);
    dVar4 = precise_unit::multiplier((precise_unit *)precise::energy::scm);
    dVar5 = precise_unit::multiplier(local_28);
    val_local = ((double)puVar1 * dVar3 * dVar4) / dVar5;
  }
  return val_local;
}

Assistant:

inline double
        extraValidConversions(double val, const UX& start, const UX2& result)
    {
        if (start.has_same_base(m.pow(3)) && result.has_same_base(J)) {
            // volume to scf or scm
            return val * start.multiplier() *
                precise::energy::scm.multiplier() / result.multiplier();
        }
        if (start.has_same_base(J) && result.has_same_base(m.pow(3))) {
            // volume to scf or scm
            return val * start.multiplier() /
                precise::energy::scm.multiplier() / result.multiplier();
        }
        return constants::invalid_conversion;
    }